

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhCursorSeek(unqlite_kv_cursor *pCursor,void *pKey,int nByte,int iPos)

{
  int rc;
  lhash_kv_cursor *pCur;
  int iPos_local;
  int nByte_local;
  void *pKey_local;
  unqlite_kv_cursor *pCursor_local;
  
  pCursor_local._4_4_ =
       lhRecordLookup((lhash_kv_engine *)pCursor->pStore,pKey,nByte,(lhcell **)(pCursor + 2));
  if (pCursor_local._4_4_ == 0) {
    *(undefined4 *)&pCursor[1].pStore = 2;
    pCursor_local._4_4_ = 0;
  }
  else {
    pCursor[2].pStore = (unqlite_kv_engine *)0x0;
    *(undefined4 *)&pCursor[1].pStore = 3;
  }
  return pCursor_local._4_4_;
}

Assistant:

static int lhCursorSeek(unqlite_kv_cursor *pCursor,const void *pKey,int nByte,int iPos)
{
	lhash_kv_cursor *pCur = (lhash_kv_cursor *)pCursor;
	int rc;
	/* Perform a lookup */
	rc = lhRecordLookup((lhash_kv_engine *)pCur->pStore,pKey,nByte,&pCur->pCell);
	if( rc != UNQLITE_OK ){
		SXUNUSED(iPos);
		pCur->pCell = 0;
		pCur->iState = L_HASH_CURSOR_STATE_DONE;
		return rc;
	}
	pCur->iState = L_HASH_CURSOR_STATE_CELL;
	return UNQLITE_OK;
}